

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

int Wlc_NtkMuxTree_rec(Gia_Man_t *pNew,int *pCtrl,int nCtrl,Vec_Int_t *vData,int Shift)

{
  int iData0;
  int iData1;
  int iLit1;
  int iLit0;
  int Shift_local;
  Vec_Int_t *vData_local;
  int nCtrl_local;
  int *pCtrl_local;
  Gia_Man_t *pNew_local;
  
  if (nCtrl == 0) {
    pNew_local._4_4_ = Vec_IntEntry(vData,Shift);
  }
  else {
    iData0 = Wlc_NtkMuxTree_rec(pNew,pCtrl,nCtrl + -1,vData,Shift);
    iData1 = Wlc_NtkMuxTree_rec(pNew,pCtrl,nCtrl + -1,vData,Shift + (1 << ((char)nCtrl - 1U & 0x1f))
                               );
    pNew_local._4_4_ = Gia_ManHashMux(pNew,pCtrl[nCtrl + -1],iData1,iData0);
  }
  return pNew_local._4_4_;
}

Assistant:

int Wlc_NtkMuxTree_rec( Gia_Man_t * pNew, int * pCtrl, int nCtrl, Vec_Int_t * vData, int Shift )
{
    int iLit0, iLit1;
    if ( nCtrl == 0 )
        return Vec_IntEntry( vData, Shift );
    iLit0 = Wlc_NtkMuxTree_rec( pNew, pCtrl, nCtrl-1, vData, Shift );
    iLit1 = Wlc_NtkMuxTree_rec( pNew, pCtrl, nCtrl-1, vData, Shift + (1<<(nCtrl-1)) );
    return Gia_ManHashMux( pNew, pCtrl[nCtrl-1], iLit1, iLit0 );
}